

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O1

char * ures_getLocaleByType_63
                 (UResourceBundle *resourceBundle,ULocDataLocaleType type,UErrorCode *status)

{
  UResourceDataEntry *pUVar1;
  
  if ((status != (UErrorCode *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (resourceBundle != (UResourceBundle *)0x0) {
      if (type == ULOC_VALID_LOCALE) {
        pUVar1 = resourceBundle->fTopLevelData;
LAB_002c9986:
        return pUVar1->fName;
      }
      if (type == ULOC_ACTUAL_LOCALE) {
        pUVar1 = resourceBundle->fData;
        goto LAB_002c9986;
      }
    }
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return (char *)0x0;
}

Assistant:

U_CAPI const char* U_EXPORT2 
ures_getLocaleByType(const UResourceBundle* resourceBundle, 
                     ULocDataLocaleType type, 
                     UErrorCode* status) {
    if (status==NULL || U_FAILURE(*status)) {
        return NULL;
    }
    if (!resourceBundle) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    } else {
        switch(type) {
        case ULOC_ACTUAL_LOCALE:
            return resourceBundle->fData->fName;
        case ULOC_VALID_LOCALE:
            return resourceBundle->fTopLevelData->fName;
        case ULOC_REQUESTED_LOCALE:
        default:
            *status = U_ILLEGAL_ARGUMENT_ERROR;
            return NULL;
        }
    }
}